

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O3

DS_STATUS ds_list_iter_next(DsListIter *iter,void **pdata)

{
  DsListEntry *pDVar1;
  DS_STATUS DVar2;
  
  DVar2 = DS_STATUS_NULL;
  if ((iter != (DsListIter *)0x0) && (iter->curr != (DsListEntry *)0x0)) {
    pDVar1 = iter->curr->next;
    iter->curr = pDVar1;
    iter->index = iter->index + 1;
    DVar2 = DS_STATUS_OK;
    if (pdata != (void **)0x0) {
      *pdata = pDVar1->data;
    }
  }
  return DVar2;
}

Assistant:

DS_STATUS ds_list_iter_next(DsListIter *iter, void **pdata)
{
    if (NULL == iter || NULL == iter->curr)
        return DS_STATUS_NULL;
    iter->curr = iter->curr->next;
    iter->index++;
    if (NULL != pdata)
        *pdata = iter->curr->data;
    return DS_STATUS_OK;
}